

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O0

Path<SquareCell> *
xmotion::AStar::IncSearch<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>
          (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *graph,SquareCell sstate,
          SquareCell gstate,CalcHeuristicFunc_t<SquareCell,_double> *calc_heuristic,
          GetNeighbourFunc_t<SquareCell,_double> *get_neighbours)

{
  SquareCell state;
  SquareCell state_00;
  bool bVar1;
  int64_t in_RCX;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *in_RDI;
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  *in_stack_00000020;
  __normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
  *in_stack_00000028;
  function<double_(SquareCell,_SquareCell)> *in_stack_00000030;
  vertex_iterator *wp;
  iterator __end0;
  iterator __begin0;
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  *__range2;
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  path_vtx;
  vertex_iterator goal_vtx;
  vertex_iterator start_vtx;
  Path<SquareCell> *path;
  vertex_iterator in_stack_00000190;
  vertex_iterator in_stack_00000198;
  function<double_(SquareCell,_SquareCell)> *__x;
  function<double_(SquareCell,_SquareCell)> *in_stack_fffffffffffffec0;
  int64_t in_stack_fffffffffffffef0;
  int64_t in_stack_ffffffffffffff00;
  __normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
  local_f0;
  undefined1 *local_e8;
  undefined1 local_dd;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  local_90;
  __node_type *local_88;
  undefined1 local_80 [48];
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  local_50;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  local_28;
  
  state.idx.y = in_RCX;
  state.idx.x = in_stack_fffffffffffffef0;
  state.id = in_stack_ffffffffffffff00;
  local_28._M_cur =
       (__node_type *)
       Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::AddVertex(in_RDI,state);
  state_00.idx.y = in_RCX;
  state_00.idx.x = in_stack_fffffffffffffef0;
  state_00.id = in_stack_ffffffffffffff00;
  local_90._M_cur =
       (__node_type *)
       Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::AddVertex(in_RDI,state_00);
  local_88 = local_28._M_cur;
  local_50._M_cur = local_90._M_cur;
  std::function<double_(SquareCell,_SquareCell)>::function
            (in_stack_fffffffffffffec0,in_stack_00000030);
  std::
  function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
  ::function((function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
              *)in_stack_fffffffffffffec0,
             (function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
              *)in_stack_00000030);
  PerformSearch<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>
            ((Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)gstate.id,
             in_stack_00000198,in_stack_00000190,
             (CalcHeuristicFunc_t<SquareCell,_double> *)gstate.idx.y,
             (GetNeighbourFunc_t<SquareCell,_double> *)gstate.idx.x);
  std::
  function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
  ::~function((function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
               *)0x101ecb);
  std::function<double_(SquareCell,_SquareCell)>::~function
            ((function<double_(SquareCell,_SquareCell)> *)0x101ed8);
  local_dd = 0;
  std::vector<SquareCell,_std::allocator<SquareCell>_>::vector
            ((vector<SquareCell,_std::allocator<SquareCell>_> *)0x101ee7);
  local_e8 = local_80;
  local_f0._M_current =
       (vertex_iterator *)
       std::
       vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
       ::begin(in_stack_00000020);
  std::
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  ::end(in_stack_00000020);
  __x = in_stack_00000030;
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_00000028,
                            (__normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
                             *)in_stack_00000020), bVar1) {
    __gnu_cxx::
    __normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
    ::operator*(&local_f0);
    Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator::operator->
              ((vertex_iterator *)0x101f43);
    std::vector<SquareCell,_std::allocator<SquareCell>_>::push_back
              ((vector<SquareCell,_std::allocator<SquareCell>_> *)in_stack_fffffffffffffec0,
               (value_type *)__x);
    __gnu_cxx::
    __normal_iterator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator_*,_std::vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>_>
    ::operator++(&local_f0);
  }
  local_dd = 1;
  std::
  vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
  ::~vector((vector<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator,_std::allocator<xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::vertex_iterator>_>
             *)in_stack_fffffffffffffec0);
  return (Path<SquareCell> *)in_RDI;
}

Assistant:

static Path<State> IncSearch(
      Graph<State, Transition, StateIndexer> *graph, State sstate, State gstate,
      CalcHeuristicFunc_t<State, Transition> calc_heuristic,
      GetNeighbourFunc_t<State, Transition> get_neighbours) {
    auto start_vtx = graph->AddVertex(sstate);
    auto goal_vtx = graph->AddVertex(gstate);
    auto path_vtx = AStar::PerformSearch(graph, start_vtx, goal_vtx,
                                         calc_heuristic, get_neighbours);

    Path<State> path;
    for (auto &wp : path_vtx) path.push_back(wp->state);
    return path;
  }